

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdUpdateTxOutAmount
              (void *handle,int net_type,char *tx_hex_string,uint32_t index,int64_t amount,
              char **tx_string)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint32_t in_ECX;
  char *in_RDX;
  int64_t in_R8;
  undefined8 *in_R9;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_1;
  TransactionContext tx;
  bool is_bitcoin;
  int result;
  string *in_stack_fffffffffffffc88;
  ConfidentialTransactionContext *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined8 in_stack_fffffffffffffca8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffcb0;
  allocator *paVar4;
  bool *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  string local_2f0;
  Amount local_2d0;
  allocator local_2b9;
  string local_2b8 [32];
  ConfidentialTransaction local_298 [2];
  string local_1e0;
  Amount local_1c0;
  allocator local_1a9;
  string local_1a8 [32];
  Transaction local_188 [2];
  byte local_cb;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  undefined4 local_3c;
  undefined8 *local_38;
  int64_t local_30;
  uint32_t local_24;
  char *local_20;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffca8 >> 0x20);
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x5e4;
    local_68.funcname = "CfdUpdateTxOutAmount";
    cfd::core::logger::warn<>(&local_68,"tx is null or empty.");
    local_8a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Failed to parameter. tx is null or empty.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffcb0,error_code,
               (string *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    local_8a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_38 == (undefined8 *)0x0) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x5ea;
    local_a8.funcname = "CfdUpdateTxOutAmount";
    cfd::core::logger::warn<>(&local_a8,"tx output is null.");
    local_ca = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Failed to parameter. tx output is null.",&local_c9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffcb0,error_code,
               (string *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    local_ca = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_cb = 0;
  cfd::capi::ConvertNetType
            ((int)((ulong)in_stack_fffffffffffffcf0 >> 0x20),in_stack_fffffffffffffce8);
  if ((local_cb & 1) == 0) {
    paVar4 = &local_2b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,local_20,paVar4);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    cfd::core::Amount::Amount(&local_2d0,local_30);
    cfd::core::ConfidentialTransaction::SetTxOutValue(local_298,local_24,&local_2d0);
    cfd::core::AbstractTransaction::GetHex_abi_cxx11_
              (&local_2f0,&local_298[0].super_AbstractTransaction);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffcf0);
    *local_38 = pcVar3;
    std::__cxx11::string::~string((string *)&local_2f0);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(in_stack_fffffffffffffc90);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,local_20,&local_1a9);
    cfd::TransactionContext::TransactionContext
              ((TransactionContext *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    cfd::core::Amount::Amount(&local_1c0,local_30);
    cfd::core::Transaction::SetTxOutValue(local_188,local_24,&local_1c0);
    cfd::core::AbstractTransaction::GetHex_abi_cxx11_
              (&local_1e0,&local_188[0].super_AbstractTransaction);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffcf0);
    *local_38 = pcVar3;
    std::__cxx11::string::~string((string *)&local_1e0);
    cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_fffffffffffffc90);
  }
  return 0;
}

Assistant:

int CfdUpdateTxOutAmount(
    void* handle, int net_type, const char* tx_hex_string, uint32_t index,
    int64_t amount, char** tx_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.SetTxOutValue(index, Amount(amount));
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.SetTxOutValue(index, Amount(amount));
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}